

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

int SstFFSGetDeferred(SstStream Stream,void *Variable,char *Name,size_t DimCount,size_t *Start,
                     size_t *Count,void *Data)

{
  void *pvVar1;
  FFSVarRec_conflict pFVar2;
  undefined8 *puVar3;
  void *pvVar4;
  size_t __size;
  
  pvVar1 = Stream->ReaderMarshalData;
  pFVar2 = LookupVarByKey(Stream,Variable);
  if (DimCount == 0) {
    memcpy(Data,(void *)(**(long **)((long)pvVar1 + 0x20) + *pFVar2->PerWriterMetaFieldOffset),
           (long)pFVar2->ElementSize);
  }
  else {
    CP_verbose(Stream,TraceVerbose,"Get request, Name %s, Start %zu, Count %zu\n",Name,*Start,*Count
              );
    puVar3 = (undefined8 *)malloc(0x38);
    *puVar3 = pFVar2;
    *(undefined4 *)(puVar3 + 1) = 0;
    __size = pFVar2->DimCount << 3;
    pvVar4 = malloc(__size);
    puVar3[3] = pvVar4;
    memcpy(pvVar4,Start,__size);
    pvVar4 = malloc(__size);
    puVar3[4] = pvVar4;
    memcpy(pvVar4,Count,__size);
    puVar3[5] = Data;
    puVar3[6] = *(undefined8 *)((long)pvVar1 + 0x18);
    *(undefined8 **)((long)pvVar1 + 0x18) = puVar3;
  }
  return (uint)(DimCount != 0);
}

Assistant:

extern int SstFFSGetDeferred(SstStream Stream, void *Variable, const char *Name, size_t DimCount,
                             const size_t *Start, const size_t *Count, void *Data)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    int GetFromWriter = 0;
    FFSVarRec Var = LookupVarByKey(Stream, Variable);

    // if Variable is in Metadata (I.E. DimCount == 0), move incoming data to
    // Data area
    if (DimCount == 0)
    {
        void *IncomingDataBase = ((char *)Info->MetadataBaseAddrs[GetFromWriter]) +
                                 Var->PerWriterMetaFieldOffset[GetFromWriter];
        memcpy(Data, IncomingDataBase, Var->ElementSize);
        return 0; // No Sync needed
    }
    else
    {
        CP_verbose(Stream, TraceVerbose, "Get request, Name %s, Start %zu, Count %zu\n", Name,
                   Start[0], Count[0]);
        // Build request structure and enter it into requests list
        FFSArrayRequest Req = malloc(sizeof(*Req));
        Req->VarRec = Var;
        Req->RequestType = Global;
        // make a copy of Start and Count request
        Req->Start = malloc(sizeof(Start[0]) * Var->DimCount);
        memcpy(Req->Start, Start, sizeof(Start[0]) * Var->DimCount);
        Req->Count = malloc(sizeof(Count[0]) * Var->DimCount);
        memcpy(Req->Count, Count, sizeof(Count[0]) * Var->DimCount);
        Req->Data = Data;
        Req->Next = Info->PendingVarRequests;
        Info->PendingVarRequests = Req;
        return 1; // Later Sync needed
    }
}